

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.cpp
# Opt level: O2

StringBuilder * __thiscall nv::StringBuilder::number(StringBuilder *this,uint i,int base)

{
  int iVar1;
  char *pcVar2;
  float fVar3;
  float fVar4;
  
  if (base < 2) {
    pcVar2 = "base >= 2";
    iVar1 = 0x179;
  }
  else {
    if ((uint)base < 0x25) goto LAB_001b30b6;
    pcVar2 = "base <= 36";
    iVar1 = 0x17a;
  }
  iVar1 = nvAbort(pcVar2,
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvcore/StrLib.cpp"
                  ,iVar1,"StringBuilder &nv::StringBuilder::number(uint, int)");
  if (iVar1 == 1) {
    raise(5);
  }
LAB_001b30b6:
  fVar3 = logf((float)i);
  fVar4 = logf((float)base);
  reserve(this,(uint)(long)(fVar3 / fVar4 + -0.5 + 1.0));
  pcVar2 = anon_unknown.dwarf_4ed21e::i2a(i,this->m_str,base);
  *pcVar2 = '\0';
  return this;
}

Assistant:

StringBuilder & StringBuilder::number( uint i, int base )
{
	nvCheck( base >= 2 );
	nvCheck( base <= 36 );

	// @@ This needs to be done correctly.
	// length = floor(log(i, base));
	uint len = uint(log(float(i)) / log(float(base)) - 0.5f + 1);
	reserve(len);

	*i2a(i, m_str, base) = 0;

	return *this;
}